

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall
FormatTest_FormatMessageExample_Test::TestBody(FormatTest_FormatMessageExample_Test *this)

{
  bool bVar1;
  AssertHelper *this_00;
  Message *in_stack_00000008;
  AssertHelper *in_stack_00000010;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  char *actual_expression;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  Type in_stack_ffffffffffffffbc;
  AssertHelper *in_stack_ffffffffffffffc0;
  char (*in_stack_ffffffffffffffc8) [10];
  char *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  AssertionResult local_18;
  
  actual_expression = &stack0xffffffffffffffc8;
  format_message<char[10]>
            (in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  testing::internal::EqHelper<false>::Compare<char[24],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),actual_expression
             ,(char (*) [24])CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
             in_stack_ffffffffffffff90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffc0);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x17c950)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffac,actual_expression);
    testing::internal::AssertHelper::operator=(in_stack_00000010,in_stack_00000008);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x17c99e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x17c9de);
  return;
}

Assistant:

TEST(FormatTest, FormatMessageExample) {
  EXPECT_EQ("[42] something happened",
      format_message(42, "{} happened", "something"));
}